

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::Generator::GeneratingDescriptorProto(Generator *this)

{
  bool bVar1;
  
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           this->file_,"net/proto2/proto/descriptor.proto");
  if (bVar1) {
    return true;
  }
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           this->file_,"google/protobuf/descriptor.proto");
  return bVar1;
}

Assistant:

bool Generator::GeneratingDescriptorProto() const {
  return file_->name() == "net/proto2/proto/descriptor.proto" ||
         file_->name() == "google/protobuf/descriptor.proto";
}